

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_export_ostream.cpp
# Opt level: O0

void __thiscall
gtest_suite_UnsignedToString_::Zero<unsigned_char>::TestBody(Zero<unsigned_char> *this)

{
  bool bVar1;
  char *message;
  pair<const_char_*,_const_char_*> pVar2;
  AssertHelper local_88;
  Message local_80 [3];
  allocator<char> local_61;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_40 [8];
  AssertionResult gtest_ar;
  char *local_28;
  pair<const_char_*,_const_char_*> x;
  base10storage<TypeParam> out;
  Zero<unsigned_char> *this_local;
  
  pstore::gsl::not_null<std::array<char,_3UL>_*>::not_null
            ((not_null<std::array<char,_3UL>_*> *)&gtest_ar.message_,
             (array<char,_3UL> *)((long)&x.second + 5));
  pVar2 = pstore::exchange::export_ns::details::to_characters<unsigned_char,_void>
                    ('\0',(not_null<std::array<char,_3UL>_*>)
                          gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl);
  local_28 = pVar2.first;
  x.first = pVar2.second;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<char_const*,void>((string *)&local_60,local_28,x.first,&local_61);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[2],_nullptr>
            ((EqHelper *)local_40,"(std::string{x.first, x.second})","\"0\"",&local_60,
             (char (*) [2])0x3022f5);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar1) {
    testing::Message::Message(local_80);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_40);
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_export_ostream.cpp"
               ,0x2a,message);
    testing::internal::AssertHelper::operator=(&local_88,local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    testing::Message::~Message(local_80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  return;
}

Assistant:

TYPED_TEST_P (UnsignedToString, Zero) {
    using namespace pstore::exchange::export_ns::details;
    base10storage<TypeParam> out;
    std::pair<char const *, char const *> const x = to_characters (TypeParam{0}, &out);
    EXPECT_EQ ((std::string{x.first, x.second}), "0");
}